

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinformation_p.h
# Opt level: O3

void __thiscall
QNetworkInformationBackend::setMetered(QNetworkInformationBackend *this,bool isMetered)

{
  QNetworkInformationBackend *pQVar1;
  QDeadlineTimer QVar2;
  
  pQVar1 = this + 0x10;
  QVar2.t2 = 0xffffffff;
  QVar2.type = 0x7fffffff;
  QVar2.t1 = (qint64)pQVar1;
  QReadWriteLock::tryLockForWrite(QVar2);
  if (this[0x21] == (QNetworkInformationBackend)isMetered) {
    pQVar1 = this + 0x11;
  }
  else {
    this[0x21] = (QNetworkInformationBackend)isMetered;
    QReadWriteLock::unlock();
    QNetworkInformationBackend::isMeteredChanged(SUB81(this,0));
  }
  if (((ulong)pQVar1 & 1) == 0) {
    return;
  }
  QReadWriteLock::unlock();
  return;
}

Assistant:

void setMetered(bool isMetered)
    {
        QWriteLocker locker(&m_lock);
        if (m_metered != isMetered) {
            m_metered = isMetered;
            locker.unlock();
            emit isMeteredChanged(isMetered);
        }
    }